

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

shared_ptr<JointPolicyPureVectorForClusteredBG> __thiscall
boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
          (boost *this,shared_ptr<PartialJointPolicyDiscretePure> *r)

{
  long lVar1;
  shared_count in_RDX;
  undefined1 auVar2 [16];
  shared_ptr<JointPolicyPureVectorForClusteredBG> sVar3;
  
  if (*(long *)r != 0) {
    auVar2 = __dynamic_cast(*(long *)r,&PartialJointPolicyDiscretePure::typeinfo,
                            &JointPolicyPureVectorForClusteredBG::typeinfo,0);
    in_RDX.pi_ = auVar2._8_8_;
    if (auVar2._0_8_ != 0) {
      *(long *)this = auVar2._0_8_;
      lVar1 = *(long *)(r + 8);
      *(long *)(this + 8) = lVar1;
      if (lVar1 != 0) {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      goto LAB_00118f16;
    }
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_00118f16:
  sVar3.pn.pi_ = in_RDX.pi_;
  sVar3.px = (element_type *)this;
  return sVar3;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}